

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  string local_38;
  
  switch(other) {
  case nullValue:
    bVar1 = this->field_0x8;
    if ((ushort)(bVar1 - 1) < 3) {
      dVar5 = asDouble(this);
      bVar3 = 1;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) goto LAB_0010cc1a;
      bVar1 = this->field_0x8;
    }
    if ((bVar1 == 5) && (bVar3 = 1, (this->value_).bool_ == false)) goto LAB_0010cc1a;
    bVar3 = bVar1;
    if (bVar1 == 4) {
      asString_abi_cxx11_(&local_38,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_38);
      if (iVar2 != 0) {
        bVar3 = this->field_0x8;
        goto LAB_0010cb7e;
      }
      bVar3 = true;
    }
    else {
LAB_0010cb7e:
      if (((bVar3 == 7) || (bVar3 == 6)) &&
         ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar3 = true;
      }
      else {
        bVar3 = bVar3 == 0;
      }
      if (bVar1 != 4) goto LAB_0010cc1a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    goto LAB_0010cc1a;
  case intValue:
    bVar4 = isInt(this);
    bVar3 = 1;
    if (bVar4) goto LAB_0010cc1a;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar5 = (this->value_).real_, -2147483648.0 <= dVar5)) {
      dVar6 = 2147483647.0;
LAB_0010cbd4:
      bVar3 = 1;
      if (dVar5 <= dVar6) goto LAB_0010cc1a;
    }
    goto LAB_0010cbda;
  case uintValue:
    bVar4 = isUInt(this);
    bVar3 = 1;
    if (bVar4) goto LAB_0010cc1a;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar5 = (this->value_).real_, 0.0 <= dVar5)) {
      dVar6 = 4294967295.0;
      goto LAB_0010cbd4;
    }
LAB_0010cbda:
    bVar4 = bVar1 == 5;
    break;
  case realValue:
  case booleanValue:
    bVar1 = this->field_0x8;
    bVar3 = 1;
    if ((ushort)(bVar1 - 1) < 3) goto LAB_0010cc1a;
    bVar4 = bVar1 == 5;
    break;
  case stringValue:
    bVar1 = this->field_0x8;
    bVar3 = 1;
    if (2 < (ushort)(bVar1 - 1)) {
      if (bVar1 < 6) {
        bVar3 = 0x31 >> (bVar1 & 0x1f);
      }
      else {
        bVar3 = 0;
      }
    }
    goto LAB_0010cc1a;
  case arrayValue:
    bVar1 = this->field_0x8;
    bVar4 = bVar1 == 6;
    break;
  case objectValue:
    bVar1 = this->field_0x8;
    bVar4 = bVar1 == 7;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                  ,0xd1a,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar3 = bVar1 == 0 | bVar4;
LAB_0010cc1a:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}